

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIViewController.cpp
# Opt level: O2

void __thiscall CLIViewController::showResult(CLIViewController *this,bool win)

{
  char *pcVar1;
  ostream *poVar2;
  undefined7 in_register_00000031;
  
  pcVar1 = "Game Over";
  if ((int)CONCAT71(in_register_00000031,win) != 0) {
    pcVar1 = "-=Congraduations ! You Win=-";
  }
  std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  showScore(this);
  poVar2 = std::operator<<((ostream *)&std::cout,"Left : Restart");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2," Right : Exit");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void CLIViewController::showResult(bool win) {
	using namespace std;
	if (win) {
		cout << "-=Congraduations ! You Win=-";
	}
	else {
		cout << "Game Over";
	}
	cout << endl << endl << endl;
	showScore();
	cout << "Left : Restart" << endl << " Right : Exit" << endl;
}